

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O0

double __thiscall ON_Xform::GetMappingXforms(ON_Xform *this,ON_Xform *P_xform,ON_Xform *N_xform)

{
  int iVar1;
  double dtol;
  double p;
  double d;
  ON_Xform *N_xform_local;
  ON_Xform *P_xform_local;
  ON_Xform *this_local;
  
  p = 0.0;
  dtol = 0.0;
  d = (double)N_xform;
  N_xform_local = P_xform;
  P_xform_local = this;
  iVar1 = Inv((double *)this,(double (*) [4])P_xform,&p,&dtol);
  if ((((iVar1 != 4) || (ABS(p) <= 3.308722450213671e-24)) ||
      (1.0 <= ABS(p) * 3.308722450213671e-24)) || (ABS(dtol) <= ABS(p) * 2.220446049250313e-16)) {
    memcpy(N_xform_local,&IdentityTransformation,0x80);
    memcpy((void *)d,&IdentityTransformation,0x80);
    p = 0.0;
  }
  else {
    *(double *)d = this->m_xform[0][0];
    *(double *)((long)d + 8) = this->m_xform[1][0];
    *(double *)((long)d + 0x10) = this->m_xform[2][0];
    *(undefined8 *)((long)d + 0x18) = 0;
    *(double *)((long)d + 0x20) = this->m_xform[0][1];
    *(double *)((long)d + 0x28) = this->m_xform[1][1];
    *(double *)((long)d + 0x30) = this->m_xform[2][1];
    *(undefined8 *)((long)d + 0x38) = 0;
    *(double *)((long)d + 0x40) = this->m_xform[0][2];
    *(double *)((long)d + 0x48) = this->m_xform[1][2];
    *(double *)((long)d + 0x50) = this->m_xform[2][2];
    *(undefined8 *)((long)d + 0x58) = 0;
    *(undefined8 *)((long)d + 0x60) = 0;
    *(undefined8 *)((long)d + 0x68) = 0;
    *(undefined8 *)((long)d + 0x70) = 0;
    *(undefined8 *)((long)d + 0x78) = 0x3ff0000000000000;
  }
  return p;
}

Assistant:

double ON_Xform::GetMappingXforms( ON_Xform& P_xform, ON_Xform& N_xform ) const
{
  double d = 0.0, p = 0.0;
  double dtol = ON_SQRT_EPSILON*ON_SQRT_EPSILON*ON_SQRT_EPSILON;
  if ( 4 == Inv( &m_xform[0][0], P_xform.m_xform, &d, &p ) 
       && fabs(d) > dtol 
       && fabs(d)*dtol < 1.0
       && fabs(p) > ON_EPSILON*fabs(d)
     )
  {
    // Set N_xform = transpose of this (only upper 3x3 matters)
    N_xform.m_xform[0][0] = m_xform[0][0];
    N_xform.m_xform[0][1] = m_xform[1][0]; 
    N_xform.m_xform[0][2] = m_xform[2][0];
    N_xform.m_xform[0][3] = 0.0;

    N_xform.m_xform[1][0] = m_xform[0][1];
    N_xform.m_xform[1][1] = m_xform[1][1];
    N_xform.m_xform[1][2] = m_xform[2][1];
    N_xform.m_xform[1][3] = 0.0;

    N_xform.m_xform[2][0] = m_xform[0][2];
    N_xform.m_xform[2][1] = m_xform[1][2];
    N_xform.m_xform[2][2] = m_xform[2][2];
    N_xform.m_xform[2][3] = 0.0;

    N_xform.m_xform[3][0] = 0.0;
    N_xform.m_xform[3][1] = 0.0;
    N_xform.m_xform[3][2] = 0.0;
    N_xform.m_xform[3][3] = 1.0;
  }
  else
  {
    P_xform = ON_Xform::IdentityTransformation;
    N_xform = ON_Xform::IdentityTransformation;
    d = 0.0;
  }
  return d;
}